

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void qt_to_latin1(uchar *dst,char16_t *src,qsizetype length)

{
  uchar *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  char16_t cVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  auVar39 = _DAT_00150a10;
  if ((ulong)length < 0x10) {
    if (length != 0) {
      lVar34 = 0;
      do {
        cVar37 = src[lVar34];
        if (0xff < (ushort)cVar37) {
          cVar37 = L'?';
        }
        dst[lVar34] = (uchar)cVar37;
        lVar34 = lVar34 + 1;
      } while (length != lVar34);
    }
    return;
  }
  if ((ulong)length < 0x21) {
    lVar34 = 0;
  }
  else {
    lVar35 = 0;
    do {
      auVar45 = psubusw(auVar39,*(undefined1 (*) [16])(src + lVar35));
      auVar46._0_2_ = -(ushort)(auVar45._0_2_ == 0);
      auVar46._2_2_ = -(ushort)(auVar45._2_2_ == 0);
      auVar46._4_2_ = -(ushort)(auVar45._4_2_ == 0);
      auVar46._6_2_ = -(ushort)(auVar45._6_2_ == 0);
      auVar46._8_2_ = -(ushort)(auVar45._8_2_ == 0);
      auVar46._10_2_ = -(ushort)(auVar45._10_2_ == 0);
      auVar46._12_2_ = -(ushort)(auVar45._12_2_ == 0);
      auVar46._14_2_ = -(ushort)(auVar45._14_2_ == 0);
      auVar47._0_2_ = auVar46._0_2_ >> 10;
      auVar47._2_2_ = auVar46._2_2_ >> 10;
      auVar47._4_2_ = auVar46._4_2_ >> 10;
      auVar47._6_2_ = auVar46._6_2_ >> 10;
      auVar47._8_2_ = auVar46._8_2_ >> 10;
      auVar47._10_2_ = auVar46._10_2_ >> 10;
      auVar47._12_2_ = auVar46._12_2_ >> 10;
      auVar47._14_2_ = auVar46._14_2_ >> 10;
      auVar47 = auVar47 | ~auVar46 & *(undefined1 (*) [16])(src + lVar35);
      auVar45 = psubusw(auVar39,*(undefined1 (*) [16])(src + lVar35 + 8));
      auVar42._0_2_ = -(ushort)(auVar45._0_2_ == 0);
      auVar42._2_2_ = -(ushort)(auVar45._2_2_ == 0);
      auVar42._4_2_ = -(ushort)(auVar45._4_2_ == 0);
      auVar42._6_2_ = -(ushort)(auVar45._6_2_ == 0);
      auVar42._8_2_ = -(ushort)(auVar45._8_2_ == 0);
      auVar42._10_2_ = -(ushort)(auVar45._10_2_ == 0);
      auVar42._12_2_ = -(ushort)(auVar45._12_2_ == 0);
      auVar42._14_2_ = -(ushort)(auVar45._14_2_ == 0);
      auVar45._0_2_ = auVar42._0_2_ >> 10;
      auVar45._2_2_ = auVar42._2_2_ >> 10;
      auVar45._4_2_ = auVar42._4_2_ >> 10;
      auVar45._6_2_ = auVar42._6_2_ >> 10;
      auVar45._8_2_ = auVar42._8_2_ >> 10;
      auVar45._10_2_ = auVar42._10_2_ >> 10;
      auVar45._12_2_ = auVar42._12_2_ >> 10;
      auVar45._14_2_ = auVar42._14_2_ >> 10;
      auVar45 = auVar45 | ~auVar42 & *(undefined1 (*) [16])(src + lVar35 + 8);
      sVar2 = auVar47._0_2_;
      sVar3 = auVar47._2_2_;
      sVar4 = auVar47._4_2_;
      sVar5 = auVar47._6_2_;
      sVar6 = auVar47._8_2_;
      sVar7 = auVar47._10_2_;
      sVar8 = auVar47._12_2_;
      sVar9 = auVar47._14_2_;
      sVar10 = auVar45._0_2_;
      sVar13 = auVar45._2_2_;
      sVar16 = auVar45._4_2_;
      sVar19 = auVar45._6_2_;
      sVar22 = auVar45._8_2_;
      sVar25 = auVar45._10_2_;
      sVar28 = auVar45._12_2_;
      sVar31 = auVar45._14_2_;
      puVar1 = dst + lVar35;
      *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar47[0] - (0xff < sVar2);
      puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar47[2] - (0xff < sVar3);
      puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar47[4] - (0xff < sVar4);
      puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar47[6] - (0xff < sVar5);
      puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar47[8] - (0xff < sVar6);
      puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar47[10] - (0xff < sVar7);
      puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar47[0xc] - (0xff < sVar8);
      puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar47[0xe] - (0xff < sVar9);
      puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar45[0] - (0xff < sVar10);
      puVar1[9] = (0 < sVar13) * (sVar13 < 0x100) * auVar45[2] - (0xff < sVar13);
      puVar1[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar45[4] - (0xff < sVar16);
      puVar1[0xb] = (0 < sVar19) * (sVar19 < 0x100) * auVar45[6] - (0xff < sVar19);
      puVar1[0xc] = (0 < sVar22) * (sVar22 < 0x100) * auVar45[8] - (0xff < sVar22);
      puVar1[0xd] = (0 < sVar25) * (sVar25 < 0x100) * auVar45[10] - (0xff < sVar25);
      puVar1[0xe] = (0 < sVar28) * (sVar28 < 0x100) * auVar45[0xc] - (0xff < sVar28);
      puVar1[0xf] = (0 < sVar31) * (sVar31 < 0x100) * auVar45[0xe] - (0xff < sVar31);
      lVar34 = lVar35 + 0x10;
      uVar36 = lVar35 + 0x30;
      lVar35 = lVar34;
    } while (uVar36 < (ulong)length);
  }
  auVar39 = psubusw(_DAT_00150a10,*(undefined1 (*) [16])(src + lVar34));
  auVar40._0_2_ = -(ushort)(auVar39._0_2_ == 0);
  auVar40._2_2_ = -(ushort)(auVar39._2_2_ == 0);
  auVar40._4_2_ = -(ushort)(auVar39._4_2_ == 0);
  auVar40._6_2_ = -(ushort)(auVar39._6_2_ == 0);
  auVar40._8_2_ = -(ushort)(auVar39._8_2_ == 0);
  auVar40._10_2_ = -(ushort)(auVar39._10_2_ == 0);
  auVar40._12_2_ = -(ushort)(auVar39._12_2_ == 0);
  auVar40._14_2_ = -(ushort)(auVar39._14_2_ == 0);
  auVar41._0_2_ = auVar40._0_2_ >> 10;
  auVar41._2_2_ = auVar40._2_2_ >> 10;
  auVar41._4_2_ = auVar40._4_2_ >> 10;
  auVar41._6_2_ = auVar40._6_2_ >> 10;
  auVar41._8_2_ = auVar40._8_2_ >> 10;
  auVar41._10_2_ = auVar40._10_2_ >> 10;
  auVar41._12_2_ = auVar40._12_2_ >> 10;
  auVar41._14_2_ = auVar40._14_2_ >> 10;
  auVar41 = auVar41 | ~auVar40 & *(undefined1 (*) [16])(src + lVar34);
  auVar39 = psubusw(_DAT_00150a10,*(undefined1 (*) [16])(src + lVar34 + 8));
  auVar43._0_2_ = -(ushort)(auVar39._0_2_ == 0);
  auVar43._2_2_ = -(ushort)(auVar39._2_2_ == 0);
  auVar43._4_2_ = -(ushort)(auVar39._4_2_ == 0);
  auVar43._6_2_ = -(ushort)(auVar39._6_2_ == 0);
  auVar43._8_2_ = -(ushort)(auVar39._8_2_ == 0);
  auVar43._10_2_ = -(ushort)(auVar39._10_2_ == 0);
  auVar43._12_2_ = -(ushort)(auVar39._12_2_ == 0);
  auVar43._14_2_ = -(ushort)(auVar39._14_2_ == 0);
  auVar44._0_2_ = auVar43._0_2_ >> 10;
  auVar44._2_2_ = auVar43._2_2_ >> 10;
  auVar44._4_2_ = auVar43._4_2_ >> 10;
  auVar44._6_2_ = auVar43._6_2_ >> 10;
  auVar44._8_2_ = auVar43._8_2_ >> 10;
  auVar44._10_2_ = auVar43._10_2_ >> 10;
  auVar44._12_2_ = auVar43._12_2_ >> 10;
  auVar44._14_2_ = auVar43._14_2_ >> 10;
  auVar44 = auVar44 | ~auVar43 & *(undefined1 (*) [16])(src + lVar34 + 8);
  sVar2 = auVar41._0_2_;
  sVar4 = auVar41._2_2_;
  sVar6 = auVar41._4_2_;
  sVar8 = auVar41._6_2_;
  sVar10 = auVar41._8_2_;
  sVar16 = auVar41._10_2_;
  sVar22 = auVar41._12_2_;
  sVar28 = auVar41._14_2_;
  sVar11 = auVar44._0_2_;
  sVar14 = auVar44._2_2_;
  sVar17 = auVar44._4_2_;
  sVar20 = auVar44._6_2_;
  sVar23 = auVar44._8_2_;
  sVar26 = auVar44._10_2_;
  sVar29 = auVar44._12_2_;
  sVar32 = auVar44._14_2_;
  auVar39 = psubusw(_DAT_00150a10,*(undefined1 (*) [16])(src + length + -0x10));
  auVar48._0_2_ = -(ushort)(auVar39._0_2_ == 0);
  auVar48._2_2_ = -(ushort)(auVar39._2_2_ == 0);
  auVar48._4_2_ = -(ushort)(auVar39._4_2_ == 0);
  auVar48._6_2_ = -(ushort)(auVar39._6_2_ == 0);
  auVar48._8_2_ = -(ushort)(auVar39._8_2_ == 0);
  auVar48._10_2_ = -(ushort)(auVar39._10_2_ == 0);
  auVar48._12_2_ = -(ushort)(auVar39._12_2_ == 0);
  auVar48._14_2_ = -(ushort)(auVar39._14_2_ == 0);
  auVar49._0_2_ = auVar48._0_2_ >> 10;
  auVar49._2_2_ = auVar48._2_2_ >> 10;
  auVar49._4_2_ = auVar48._4_2_ >> 10;
  auVar49._6_2_ = auVar48._6_2_ >> 10;
  auVar49._8_2_ = auVar48._8_2_ >> 10;
  auVar49._10_2_ = auVar48._10_2_ >> 10;
  auVar49._12_2_ = auVar48._12_2_ >> 10;
  auVar49._14_2_ = auVar48._14_2_ >> 10;
  auVar49 = auVar49 | ~auVar48 & *(undefined1 (*) [16])(src + length + -0x10);
  auVar39 = psubusw(_DAT_00150a10,*(undefined1 (*) [16])(src + length + -8));
  auVar38._0_2_ = -(ushort)(auVar39._0_2_ == 0);
  auVar38._2_2_ = -(ushort)(auVar39._2_2_ == 0);
  auVar38._4_2_ = -(ushort)(auVar39._4_2_ == 0);
  auVar38._6_2_ = -(ushort)(auVar39._6_2_ == 0);
  auVar38._8_2_ = -(ushort)(auVar39._8_2_ == 0);
  auVar38._10_2_ = -(ushort)(auVar39._10_2_ == 0);
  auVar38._12_2_ = -(ushort)(auVar39._12_2_ == 0);
  auVar38._14_2_ = -(ushort)(auVar39._14_2_ == 0);
  auVar39._0_2_ = auVar38._0_2_ >> 10;
  auVar39._2_2_ = auVar38._2_2_ >> 10;
  auVar39._4_2_ = auVar38._4_2_ >> 10;
  auVar39._6_2_ = auVar38._6_2_ >> 10;
  auVar39._8_2_ = auVar38._8_2_ >> 10;
  auVar39._10_2_ = auVar38._10_2_ >> 10;
  auVar39._12_2_ = auVar38._12_2_ >> 10;
  auVar39._14_2_ = auVar38._14_2_ >> 10;
  auVar39 = auVar39 | ~auVar38 & *(undefined1 (*) [16])(src + length + -8);
  sVar3 = auVar49._0_2_;
  sVar5 = auVar49._2_2_;
  sVar7 = auVar49._4_2_;
  sVar9 = auVar49._6_2_;
  sVar13 = auVar49._8_2_;
  sVar19 = auVar49._10_2_;
  sVar25 = auVar49._12_2_;
  sVar31 = auVar49._14_2_;
  sVar12 = auVar39._0_2_;
  sVar15 = auVar39._2_2_;
  sVar18 = auVar39._4_2_;
  sVar21 = auVar39._6_2_;
  sVar24 = auVar39._8_2_;
  sVar27 = auVar39._10_2_;
  sVar30 = auVar39._12_2_;
  sVar33 = auVar39._14_2_;
  puVar1 = dst + lVar34;
  *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar41[0] - (0xff < sVar2);
  puVar1[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar41[2] - (0xff < sVar4);
  puVar1[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar41[4] - (0xff < sVar6);
  puVar1[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar41[6] - (0xff < sVar8);
  puVar1[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar41[8] - (0xff < sVar10);
  puVar1[5] = (0 < sVar16) * (sVar16 < 0x100) * auVar41[10] - (0xff < sVar16);
  puVar1[6] = (0 < sVar22) * (sVar22 < 0x100) * auVar41[0xc] - (0xff < sVar22);
  puVar1[7] = (0 < sVar28) * (sVar28 < 0x100) * auVar41[0xe] - (0xff < sVar28);
  puVar1[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar44[0] - (0xff < sVar11);
  puVar1[9] = (0 < sVar14) * (sVar14 < 0x100) * auVar44[2] - (0xff < sVar14);
  puVar1[10] = (0 < sVar17) * (sVar17 < 0x100) * auVar44[4] - (0xff < sVar17);
  puVar1[0xb] = (0 < sVar20) * (sVar20 < 0x100) * auVar44[6] - (0xff < sVar20);
  puVar1[0xc] = (0 < sVar23) * (sVar23 < 0x100) * auVar44[8] - (0xff < sVar23);
  puVar1[0xd] = (0 < sVar26) * (sVar26 < 0x100) * auVar44[10] - (0xff < sVar26);
  puVar1[0xe] = (0 < sVar29) * (sVar29 < 0x100) * auVar44[0xc] - (0xff < sVar29);
  puVar1[0xf] = (0 < sVar32) * (sVar32 < 0x100) * auVar44[0xe] - (0xff < sVar32);
  puVar1 = dst + length + -0x10;
  *puVar1 = (0 < sVar3) * (sVar3 < 0x100) * auVar49[0] - (0xff < sVar3);
  puVar1[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar49[2] - (0xff < sVar5);
  puVar1[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar49[4] - (0xff < sVar7);
  puVar1[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar49[6] - (0xff < sVar9);
  puVar1[4] = (0 < sVar13) * (sVar13 < 0x100) * auVar49[8] - (0xff < sVar13);
  puVar1[5] = (0 < sVar19) * (sVar19 < 0x100) * auVar49[10] - (0xff < sVar19);
  puVar1[6] = (0 < sVar25) * (sVar25 < 0x100) * auVar49[0xc] - (0xff < sVar25);
  puVar1[7] = (0 < sVar31) * (sVar31 < 0x100) * auVar49[0xe] - (0xff < sVar31);
  puVar1[8] = (0 < sVar12) * (sVar12 < 0x100) * auVar39[0] - (0xff < sVar12);
  puVar1[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar39[2] - (0xff < sVar15);
  puVar1[10] = (0 < sVar18) * (sVar18 < 0x100) * auVar39[4] - (0xff < sVar18);
  puVar1[0xb] = (0 < sVar21) * (sVar21 < 0x100) * auVar39[6] - (0xff < sVar21);
  puVar1[0xc] = (0 < sVar24) * (sVar24 < 0x100) * auVar39[8] - (0xff < sVar24);
  puVar1[0xd] = (0 < sVar27) * (sVar27 < 0x100) * auVar39[10] - (0xff < sVar27);
  puVar1[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar39[0xc] - (0xff < sVar30);
  puVar1[0xf] = (0 < sVar33) * (sVar33 < 0x100) * auVar39[0xe] - (0xff < sVar33);
  return;
}

Assistant:

static void qt_to_latin1_internal(uchar *dst, const char16_t *src, qsizetype length)
{
#if defined(__SSE2__)
    auto questionMark256 = []() {
        if constexpr (UseAvx2)
            return _mm256_broadcastw_epi16(_mm_cvtsi32_si128('?'));
        else
            return 0;
    }();
    auto outOfRange256 = []() {
        if constexpr (UseAvx2)
            return _mm256_broadcastw_epi16(_mm_cvtsi32_si128(0x100));
        else
            return 0;
    }();
    __m128i questionMark, outOfRange;
    if constexpr (UseAvx2) {
        questionMark = _mm256_castsi256_si128(questionMark256);
        outOfRange = _mm256_castsi256_si128(outOfRange256);
    } else {
        questionMark = _mm_set1_epi16('?');
        outOfRange = _mm_set1_epi16(0x100);
    }

    auto mergeQuestionMarks = [=](__m128i chunk) {
        if (!Checked)
            return chunk;

        // SSE has no compare instruction for unsigned comparison.
        if constexpr (UseSse4_1) {
            // We use an unsigned uc = qMin(uc, 0x100) and then compare for equality.
            chunk = _mm_min_epu16(chunk, outOfRange);
            const __m128i offLimitMask = _mm_cmpeq_epi16(chunk, outOfRange);
            chunk = _mm_blendv_epi8(chunk, questionMark, offLimitMask);
            return chunk;
        }
        // The variables must be shiffted + 0x8000 to be compared
        const __m128i signedBitOffset = _mm_set1_epi16(short(0x8000));
        const __m128i thresholdMask = _mm_set1_epi16(short(0xff + 0x8000));

        const __m128i signedChunk = _mm_add_epi16(chunk, signedBitOffset);
        const __m128i offLimitMask = _mm_cmpgt_epi16(signedChunk, thresholdMask);

        // offLimitQuestionMark contains '?' for each 16 bits that was off-limit
        // the 16 bits that were correct contains zeros
        const __m128i offLimitQuestionMark = _mm_and_si128(offLimitMask, questionMark);

        // correctBytes contains the bytes that were in limit
        // the 16 bits that were off limits contains zeros
        const __m128i correctBytes = _mm_andnot_si128(offLimitMask, chunk);

        // merge offLimitQuestionMark and correctBytes to have the result
        chunk = _mm_or_si128(correctBytes, offLimitQuestionMark);

        Q_UNUSED(outOfRange);
        return chunk;
    };

    // we're going to read to src[offset..offset+15] (16 bytes)
    auto loadChunkAt = [=](qptrdiff offset) {
        __m128i chunk1, chunk2;
        if constexpr (UseAvx2) {
            __m256i chunk = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(src + offset));
            if (Checked) {
                // See mergeQuestionMarks lambda above for details
                chunk = _mm256_min_epu16(chunk, outOfRange256);
                const __m256i offLimitMask = _mm256_cmpeq_epi16(chunk, outOfRange256);
                chunk = _mm256_blendv_epi8(chunk, questionMark256, offLimitMask);
            }

            chunk2 = _mm256_extracti128_si256(chunk, 1);
            chunk1 = _mm256_castsi256_si128(chunk);
        } else {
            chunk1 = _mm_loadu_si128((const __m128i*)(src + offset)); // load
            chunk1 = mergeQuestionMarks(chunk1);

            chunk2 = _mm_loadu_si128((const __m128i*)(src + offset + 8)); // load
            chunk2 = mergeQuestionMarks(chunk2);
        }

        // pack the two vector to 16 x 8bits elements
        return _mm_packus_epi16(chunk1, chunk2);
    };

    if (size_t(length) >= sizeof(__m128i)) {
        // because of possible overlapping, we won't process the last chunk in the loop
        qptrdiff offset = 0;
        for ( ; offset + 2 * sizeof(__m128i) < size_t(length); offset += sizeof(__m128i))
            _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + offset), loadChunkAt(offset));

        // overlapped conversion of the last full chunk and the tail
        __m128i last1 = loadChunkAt(offset);
        __m128i last2 = loadChunkAt(length - sizeof(__m128i));
        _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + offset), last1);
        _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + length - sizeof(__m128i)), last2);
        return;
    }

#  if !defined(__OPTIMIZE_SIZE__)
    if (length >= 4) {
        // this code is fine even for in-place conversion because we load both
        // before any store
        if (length >= 8) {
            __m128i chunk1 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(src));
            __m128i chunk2 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(src + length - 8));
            chunk1 = mergeQuestionMarks(chunk1);
            chunk2 = mergeQuestionMarks(chunk2);

            // pack, where the upper half is ignored
            const __m128i result1 = _mm_packus_epi16(chunk1, chunk1);
            const __m128i result2 = _mm_packus_epi16(chunk2, chunk2);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst), result1);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst + length - 8), result2);
        } else {
            __m128i chunk1 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(src));
            __m128i chunk2 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(src + length - 4));
            chunk1 = mergeQuestionMarks(chunk1);
            chunk2 = mergeQuestionMarks(chunk2);

            // pack, we'll zero the upper three quarters
            const __m128i result1 = _mm_packus_epi16(chunk1, chunk1);
            const __m128i result2 = _mm_packus_epi16(chunk2, chunk2);
            qToUnaligned(_mm_cvtsi128_si32(result1), dst);
            qToUnaligned(_mm_cvtsi128_si32(result2), dst + length - 4);
        }
        return;
    }

    length = length % 4;
    return UnrollTailLoop<3>::exec(length, [=](qsizetype i) {
        if (Checked)
            dst[i] = (src[i]>0xff) ? '?' : (uchar) src[i];
        else
            dst[i] = src[i];
    });
#  else
    length = length % 16;
#  endif // optimize size
#elif defined(__ARM_NEON__)
    // Refer to the documentation of the SSE2 implementation.
    // This uses exactly the same method as for SSE except:
    // 1) neon has unsigned comparison
    // 2) packing is done to 64 bits (8 x 8bits component).
    if (length >= 16) {
        const qsizetype chunkCount = length >> 3; // divided by 8
        const uint16x8_t questionMark = vdupq_n_u16('?'); // set
        const uint16x8_t thresholdMask = vdupq_n_u16(0xff); // set
        for (qsizetype i = 0; i < chunkCount; ++i) {
            uint16x8_t chunk = vld1q_u16((uint16_t *)src); // load
            src += 8;

            if (Checked) {
                const uint16x8_t offLimitMask = vcgtq_u16(chunk, thresholdMask); // chunk > thresholdMask
                const uint16x8_t offLimitQuestionMark = vandq_u16(offLimitMask, questionMark); // offLimitMask & questionMark
                const uint16x8_t correctBytes = vbicq_u16(chunk, offLimitMask); // !offLimitMask & chunk
                chunk = vorrq_u16(correctBytes, offLimitQuestionMark); // correctBytes | offLimitQuestionMark
            }
            const uint8x8_t result = vmovn_u16(chunk); // narrowing move->packing
            vst1_u8(dst, result); // store
            dst += 8;
        }
        length = length % 8;
    }
#endif
#if defined(__mips_dsp)
    static_assert(sizeof(qsizetype) == sizeof(int),
                  "oops, the assembler implementation needs to be called in a loop");
    qt_toLatin1_mips_dsp_asm(dst, src, length);
#else
    while (length--) {
        if (Checked)
            *dst++ = (*src>0xff) ? '?' : (uchar) *src;
        else
            *dst++ = *src;
        ++src;
    }
#endif
}